

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O3

bool __thiscall S2Loop::BoundaryApproxEquals(S2Loop *this,S2Loop *b,S1Angle max_error)

{
  bool bVar1;
  S2Point *pSVar2;
  S2Point *pSVar3;
  int iVar4;
  int i;
  
  iVar4 = this->num_vertices_;
  if (iVar4 == b->num_vertices_) {
    if (iVar4 == 1) {
      return this->origin_inside_ == b->origin_inside_;
    }
    i = 0;
    if (0 < iVar4) {
      do {
        pSVar2 = vertex(this,i);
        pSVar3 = vertex(b,0);
        bVar1 = S2::ApproxEquals(pSVar2,pSVar3,max_error);
        if (bVar1) {
          if (this->num_vertices_ < 1) {
            return true;
          }
          iVar4 = 0;
          while( true ) {
            pSVar2 = vertex(this,i + iVar4);
            pSVar3 = vertex(b,iVar4);
            bVar1 = S2::ApproxEquals(pSVar2,pSVar3,max_error);
            if (!bVar1) break;
            iVar4 = iVar4 + 1;
            if (this->num_vertices_ <= iVar4) {
              return true;
            }
          }
        }
        i = i + 1;
      } while (i < this->num_vertices_);
      return false;
    }
  }
  return false;
}

Assistant:

bool S2Loop::BoundaryApproxEquals(const S2Loop& b, S1Angle max_error) const {
  if (num_vertices() != b.num_vertices()) return false;

  // Special case to handle empty or full loops.  Since they have the same
  // number of vertices, if one loop is empty/full then so is the other.
  if (is_empty_or_full()) return is_empty() == b.is_empty();

  for (int offset = 0; offset < num_vertices(); ++offset) {
    if (S2::ApproxEquals(vertex(offset), b.vertex(0), max_error)) {
      bool success = true;
      for (int i = 0; i < num_vertices(); ++i) {
        if (!S2::ApproxEquals(vertex(i + offset), b.vertex(i), max_error)) {
          success = false;
          break;
        }
      }
      if (success) return true;
      // Otherwise continue looping.  There may be more than one candidate
      // starting offset since vertices are only matched approximately.
    }
  }
  return false;
}